

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O0

void __thiscall
webrtc::CompositionConverter::Convert
          (CompositionConverter *this,float **src,size_t src_size,float **dst,size_t dst_capacity)

{
  reference pvVar1;
  pointer pAVar2;
  reference pvVar3;
  pointer pCVar4;
  float **ppfVar5;
  size_t sVar6;
  value_type *pvVar7;
  reference this_00;
  float **ppfVar8;
  size_t sVar9;
  value_type *dst_buffer;
  value_type *src_buffer;
  size_t i;
  size_t dst_capacity_local;
  float **dst_local;
  size_t src_size_local;
  float **src_local;
  CompositionConverter *this_local;
  
  pvVar1 = std::
           vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ::front(&this->converters_);
  pAVar2 = std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
           operator->(pvVar1);
  pvVar3 = std::
           vector<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
           ::front(&this->buffers_);
  pCVar4 = std::
           unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ::operator->(pvVar3);
  ppfVar5 = ChannelBuffer<float>::channels(pCVar4);
  pvVar3 = std::
           vector<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
           ::front(&this->buffers_);
  pCVar4 = std::
           unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ::operator->(pvVar3);
  sVar6 = ChannelBuffer<float>::size(pCVar4);
  (*pAVar2->_vptr_AudioConverter[2])(pAVar2,src,src_size,ppfVar5,sVar6);
  src_buffer = (value_type *)0x2;
  while( true ) {
    pvVar7 = (value_type *)
             std::
             vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
             ::size(&this->converters_);
    if (pvVar7 <= src_buffer) break;
    pvVar3 = std::
             vector<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
             ::operator[](&this->buffers_,
                          (size_type)
                          ((long)&src_buffer[-1]._M_t.
                                  super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                                  .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>.
                                  _M_head_impl + 6));
    this_00 = std::
              vector<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
              ::operator[](&this->buffers_,
                           (size_type)
                           ((long)&src_buffer[-1]._M_t.
                                   super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                                   .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>.
                                   _M_head_impl + 7));
    pvVar1 = std::
             vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
             ::operator[](&this->converters_,(size_type)src_buffer);
    pAVar2 = std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
             operator->(pvVar1);
    pCVar4 = std::
             unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
             ::operator->(pvVar3);
    ppfVar5 = ChannelBuffer<float>::channels(pCVar4);
    pCVar4 = std::
             unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
             ::operator->(pvVar3);
    sVar6 = ChannelBuffer<float>::size(pCVar4);
    pCVar4 = std::
             unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
             ::operator->(this_00);
    ppfVar8 = ChannelBuffer<float>::channels(pCVar4);
    pCVar4 = std::
             unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
             ::operator->(this_00);
    sVar9 = ChannelBuffer<float>::size(pCVar4);
    (*pAVar2->_vptr_AudioConverter[2])(pAVar2,ppfVar5,sVar6,ppfVar8,sVar9);
    src_buffer = (value_type *)
                 ((long)&(src_buffer->_M_t).
                         super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                         .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl
                 + 1);
  }
  pvVar1 = std::
           vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ::back(&this->converters_);
  pAVar2 = std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>::
           operator->(pvVar1);
  pvVar3 = std::
           vector<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
           ::back(&this->buffers_);
  pCVar4 = std::
           unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ::operator->(pvVar3);
  ppfVar5 = ChannelBuffer<float>::channels(pCVar4);
  pvVar3 = std::
           vector<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
           ::back(&this->buffers_);
  pCVar4 = std::
           unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ::operator->(pvVar3);
  sVar6 = ChannelBuffer<float>::size(pCVar4);
  (*pAVar2->_vptr_AudioConverter[2])(pAVar2,ppfVar5,sVar6,dst,dst_capacity);
  return;
}

Assistant:

void Convert(const float* const* src, size_t src_size, float* const* dst,
               size_t dst_capacity) override {
    converters_.front()->Convert(src, src_size, buffers_.front()->channels(),
                                 buffers_.front()->size());
    for (size_t i = 2; i < converters_.size(); ++i) {
      auto& src_buffer = buffers_[i - 2];
      auto& dst_buffer = buffers_[i - 1];
      converters_[i]->Convert(src_buffer->channels(),
                              src_buffer->size(),
                              dst_buffer->channels(),
                              dst_buffer->size());
    }
    converters_.back()->Convert(buffers_.back()->channels(),
                                buffers_.back()->size(), dst, dst_capacity);
  }